

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fshook_stdio.c
# Opt level: O0

_Bool fs_stdio_entry_exists(ALLEGRO_FS_ENTRY *fp)

{
  int iVar1;
  int *piVar2;
  long in_RDI;
  WRAP_STAT_TYPE st;
  ALLEGRO_FS_ENTRY_STDIO *fp_stdio;
  int in_stack_ffffffffffffff64;
  _Bool local_1;
  
  iVar1 = stat(*(char **)(in_RDI + 8),(stat *)&stack0xffffffffffffff58);
  if (iVar1 == 0) {
    local_1 = true;
  }
  else {
    piVar2 = __errno_location();
    if (*piVar2 != 2) {
      __errno_location();
      al_set_errno(in_stack_ffffffffffffff64);
    }
    local_1 = false;
  }
  return local_1;
}

Assistant:

static bool fs_stdio_entry_exists(ALLEGRO_FS_ENTRY *fp)
{
   ALLEGRO_FS_ENTRY_STDIO *fp_stdio = (ALLEGRO_FS_ENTRY_STDIO *) fp;
   WRAP_STAT_TYPE st;

   if (WRAP_STAT(fp_stdio->abs_path, &st) != 0) {
      if (errno != ENOENT) {
         al_set_errno(errno);
      }
      return false;
   }

   return true;
}